

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(const_chaiscript::Boxed_Number_&),_chaiscript::dispatch::detail::Fun_Caller<std::shared_ptr<unsigned_short>,_const_chaiscript::Boxed_Number_&>_>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(const_chaiscript::Boxed_Number_&),_chaiscript::dispatch::detail::Fun_Caller<std::shared_ptr<unsigned_short>,_const_chaiscript::Boxed_Number_&>_>
           *this,Fun_Caller<std::shared_ptr<unsigned_short>,_const_chaiscript::Boxed_Number_&> f)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  _func_shared_ptr<unsigned_short>_Boxed_Number_ptr *in_stack_00000028;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffffd0;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffffd8;
  Proxy_Function_Impl_Base *in_stack_ffffffffffffffe0;
  
  dispatch::detail::
  build_param_type_list<std::shared_ptr<unsigned_short>,chaiscript::Boxed_Number_const&>
            (in_stack_00000028);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector
            (in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__Proxy_Function_Callable_Impl_005c8988;
  in_RDI[5] = in_RSI;
  return;
}

Assistant:

Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr))),
            m_f(std::move(f))
        {
        }